

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# spxsolve.hpp
# Opt level: O1

bool __thiscall
soplex::
SPxSolverBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
::precisionReached(SPxSolverBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                   *this,number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
                         *newpricertol)

{
  SPxOut *pSVar1;
  Real RVar2;
  char cVar3;
  int iVar4;
  bool bVar5;
  number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
  maxViolConst;
  number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
  maxViolBounds;
  number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
  maxViolRedCost;
  number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
  sumViolConst;
  number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
  sumViolBounds;
  number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
  sumViolRedCost;
  Verbosity old_verbosity;
  number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
  result;
  cpp_dec_float<100U,_int,_void> local_588;
  cpp_dec_float<100U,_int,_void> local_538;
  cpp_dec_float<100U,_int,_void> local_4e8;
  uint local_498 [14];
  undefined5 uStack_460;
  undefined3 uStack_45b;
  int iStack_458;
  undefined1 uStack_454;
  undefined8 local_450;
  uint local_448 [14];
  undefined5 uStack_410;
  undefined3 uStack_40b;
  int iStack_408;
  undefined1 uStack_404;
  undefined8 local_400;
  uint local_3f8 [14];
  undefined5 uStack_3c0;
  undefined3 uStack_3bb;
  int iStack_3b8;
  undefined1 uStack_3b4;
  undefined8 local_3b0;
  cpp_dec_float<100U,_int,_void> local_3a8;
  cpp_dec_float<100U,_int,_void> local_358;
  number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
  local_308;
  number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
  local_2b8;
  number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
  local_268;
  number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
  local_218;
  number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
  local_1c8;
  number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
  local_178;
  number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
  local_128;
  number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
  local_d0;
  cpp_dec_float<100U,_int,_void> local_80;
  
  local_4e8.fpclass = cpp_dec_float_finite;
  local_4e8.prec_elem = 0x10;
  local_4e8.data._M_elems[0] = 0;
  local_4e8.data._M_elems[1] = 0;
  local_4e8.data._M_elems[2] = 0;
  local_4e8.data._M_elems[3] = 0;
  local_4e8.data._M_elems[4] = 0;
  local_4e8.data._M_elems[5] = 0;
  local_4e8.data._M_elems[6] = 0;
  local_4e8.data._M_elems[7] = 0;
  local_4e8.data._M_elems[8] = 0;
  local_4e8.data._M_elems[9] = 0;
  local_4e8.data._M_elems[10] = 0;
  local_4e8.data._M_elems[0xb] = 0;
  local_4e8.data._M_elems[0xc] = 0;
  local_4e8.data._M_elems[0xd] = 0;
  local_4e8.data._M_elems._56_5_ = 0;
  local_4e8.data._M_elems[0xf]._1_3_ = 0;
  local_4e8.exp = 0;
  local_4e8.neg = false;
  local_3b0._0_4_ = cpp_dec_float_finite;
  local_3b0._4_4_ = 0x10;
  local_3f8[0] = 0;
  local_3f8[1] = 0;
  local_3f8[2] = 0;
  local_3f8[3] = 0;
  local_3f8[4] = 0;
  local_3f8[5] = 0;
  local_3f8[6] = 0;
  local_3f8[7] = 0;
  local_3f8[8] = 0;
  local_3f8[9] = 0;
  local_3f8[10] = 0;
  local_3f8[0xb] = 0;
  local_3f8[0xc] = 0;
  local_3f8[0xd] = 0;
  uStack_3c0 = 0;
  uStack_3bb = 0;
  iStack_3b8 = 0;
  uStack_3b4 = 0;
  local_538.fpclass = cpp_dec_float_finite;
  local_538.prec_elem = 0x10;
  local_538.data._M_elems[0] = 0;
  local_538.data._M_elems[1] = 0;
  local_538.data._M_elems[2] = 0;
  local_538.data._M_elems[3] = 0;
  local_538.data._M_elems[4] = 0;
  local_538.data._M_elems[5] = 0;
  local_538.data._M_elems[6] = 0;
  local_538.data._M_elems[7] = 0;
  local_538.data._M_elems[8] = 0;
  local_538.data._M_elems[9] = 0;
  local_538.data._M_elems[10] = 0;
  local_538.data._M_elems[0xb] = 0;
  local_538.data._M_elems[0xc] = 0;
  local_538.data._M_elems[0xd] = 0;
  local_538.data._M_elems._56_5_ = 0;
  local_538.data._M_elems[0xf]._1_3_ = 0;
  local_538.exp = 0;
  local_538.neg = false;
  local_400._0_4_ = cpp_dec_float_finite;
  local_400._4_4_ = 0x10;
  local_448[0] = 0;
  local_448[1] = 0;
  local_448[2] = 0;
  local_448[3] = 0;
  local_448[4] = 0;
  local_448[5] = 0;
  local_448[6] = 0;
  local_448[7] = 0;
  local_448[8] = 0;
  local_448[9] = 0;
  local_448[10] = 0;
  local_448[0xb] = 0;
  local_448[0xc] = 0;
  local_448[0xd] = 0;
  uStack_410 = 0;
  uStack_40b = 0;
  iStack_408 = 0;
  uStack_404 = 0;
  local_588.fpclass = cpp_dec_float_finite;
  local_588.prec_elem = 0x10;
  local_588.data._M_elems[0] = 0;
  local_588.data._M_elems[1] = 0;
  local_588.data._M_elems[2] = 0;
  local_588.data._M_elems[3] = 0;
  local_588.data._M_elems[4] = 0;
  local_588.data._M_elems[5] = 0;
  local_588.data._M_elems[6] = 0;
  local_588.data._M_elems[7] = 0;
  local_588.data._M_elems[8] = 0;
  local_588.data._M_elems[9] = 0;
  local_588.data._M_elems[10] = 0;
  local_588.data._M_elems[0xb] = 0;
  local_588.data._M_elems[0xc] = 0;
  local_588.data._M_elems[0xd] = 0;
  local_588.data._M_elems._56_5_ = 0;
  local_588.data._M_elems[0xf]._1_3_ = 0;
  local_588.exp = 0;
  local_588.neg = false;
  local_450._0_4_ = cpp_dec_float_finite;
  local_450._4_4_ = 0x10;
  local_498[0] = 0;
  local_498[1] = 0;
  local_498[2] = 0;
  local_498[3] = 0;
  local_498[4] = 0;
  local_498[5] = 0;
  local_498[6] = 0;
  local_498[7] = 0;
  local_498[8] = 0;
  local_498[9] = 0;
  local_498[10] = 0;
  local_498[0xb] = 0;
  local_498[0xc] = 0;
  local_498[0xd] = 0;
  uStack_460 = 0;
  uStack_45b = 0;
  iStack_458 = 0;
  uStack_454 = 0;
  (*(this->
    super_SPxLPBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
    ).
    super_LPRowSetBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
    .
    super_SVSetBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
    .
    super_ClassArray<soplex::Nonzero<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>_>
    ._vptr_ClassArray[0x72])();
  (*(this->
    super_SPxLPBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
    ).
    super_LPRowSetBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
    .
    super_SVSetBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
    .
    super_ClassArray<soplex::Nonzero<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>_>
    ._vptr_ClassArray[0x70])(this,&local_538,local_448);
  (*(this->
    super_SPxLPBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
    ).
    super_LPRowSetBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
    .
    super_SVSetBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
    .
    super_ClassArray<soplex::Nonzero<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>_>
    ._vptr_ClassArray[0x6f])(this,&local_588,local_498);
  RVar2 = Tolerances::floatingPointOpttol
                    ((this->
                     super_SPxLPBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                     )._tolerances.
                     super___shared_ptr<soplex::Tolerances,_(__gnu_cxx::_Lock_policy)2>._M_ptr);
  if (!NAN(RVar2)) {
    bVar5 = false;
    if (local_4e8.fpclass == cpp_dec_float_NaN) goto LAB_0038af0f;
    local_3a8.fpclass = cpp_dec_float_finite;
    local_3a8.prec_elem = 0x10;
    local_3a8.data._M_elems[0] = 0;
    local_3a8.data._M_elems[1] = 0;
    local_3a8.data._M_elems[2] = 0;
    local_3a8.data._M_elems[3] = 0;
    local_3a8.data._M_elems[4] = 0;
    local_3a8.data._M_elems[5] = 0;
    local_3a8.data._M_elems[6] = 0;
    local_3a8.data._M_elems[7] = 0;
    local_3a8.data._M_elems[8] = 0;
    local_3a8.data._M_elems[9] = 0;
    local_3a8.data._M_elems[10] = 0;
    local_3a8.data._M_elems[0xb] = 0;
    local_3a8.data._M_elems[0xc] = 0;
    local_3a8.data._M_elems[0xd] = 0;
    local_3a8.data._M_elems._56_5_ = 0;
    local_3a8.data._M_elems[0xf]._1_3_ = 0;
    local_3a8.exp = 0;
    local_3a8.neg = false;
    boost::multiprecision::backends::cpp_dec_float<100u,int,void>::operator=
              ((cpp_dec_float<100u,int,void> *)&local_3a8,RVar2);
    iVar4 = boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>::compare
                      (&local_4e8,&local_3a8);
    if (iVar4 < 0) {
      RVar2 = Tolerances::floatingPointFeastol
                        ((this->
                         super_SPxLPBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                         )._tolerances.
                         super___shared_ptr<soplex::Tolerances,_(__gnu_cxx::_Lock_policy)2>._M_ptr);
      bVar5 = false;
      if ((NAN(RVar2)) || (local_538.fpclass == cpp_dec_float_NaN)) goto LAB_0038af0f;
      local_3a8.fpclass = cpp_dec_float_finite;
      local_3a8.prec_elem = 0x10;
      local_3a8.data._M_elems[0] = 0;
      local_3a8.data._M_elems[1] = 0;
      local_3a8.data._M_elems[2] = 0;
      local_3a8.data._M_elems[3] = 0;
      local_3a8.data._M_elems[4] = 0;
      local_3a8.data._M_elems[5] = 0;
      local_3a8.data._M_elems[6] = 0;
      local_3a8.data._M_elems[7] = 0;
      local_3a8.data._M_elems[8] = 0;
      local_3a8.data._M_elems[9] = 0;
      local_3a8.data._M_elems[10] = 0;
      local_3a8.data._M_elems[0xb] = 0;
      local_3a8.data._M_elems[0xc] = 0;
      local_3a8.data._M_elems[0xd] = 0;
      local_3a8.data._M_elems._56_5_ = 0;
      local_3a8.data._M_elems[0xf]._1_3_ = 0;
      local_3a8.exp = 0;
      local_3a8.neg = false;
      boost::multiprecision::backends::cpp_dec_float<100u,int,void>::operator=
                ((cpp_dec_float<100u,int,void> *)&local_3a8,RVar2);
      iVar4 = boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>::compare
                        (&local_538,&local_3a8);
      if (iVar4 < 0) {
        RVar2 = Tolerances::floatingPointFeastol
                          ((this->
                           super_SPxLPBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                           )._tolerances.
                           super___shared_ptr<soplex::Tolerances,_(__gnu_cxx::_Lock_policy)2>._M_ptr
                          );
        bVar5 = false;
        if ((!NAN(RVar2)) && (local_588.fpclass != cpp_dec_float_NaN)) {
          local_3a8.fpclass = cpp_dec_float_finite;
          local_3a8.prec_elem = 0x10;
          local_3a8.data._M_elems[0] = 0;
          local_3a8.data._M_elems[1] = 0;
          local_3a8.data._M_elems[2] = 0;
          local_3a8.data._M_elems[3] = 0;
          local_3a8.data._M_elems[4] = 0;
          local_3a8.data._M_elems[5] = 0;
          local_3a8.data._M_elems[6] = 0;
          local_3a8.data._M_elems[7] = 0;
          local_3a8.data._M_elems[8] = 0;
          local_3a8.data._M_elems[9] = 0;
          local_3a8.data._M_elems[10] = 0;
          local_3a8.data._M_elems[0xb] = 0;
          local_3a8.data._M_elems[0xc] = 0;
          local_3a8.data._M_elems[0xd] = 0;
          local_3a8.data._M_elems._56_5_ = 0;
          local_3a8.data._M_elems[0xf]._1_3_ = 0;
          local_3a8.exp = 0;
          local_3a8.neg = false;
          boost::multiprecision::backends::cpp_dec_float<100u,int,void>::operator=
                    ((cpp_dec_float<100u,int,void> *)&local_3a8,RVar2);
          iVar4 = boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>::compare
                            (&local_588,&local_3a8);
          bVar5 = SUB41((uint)iVar4 >> 0x1f,0);
        }
        goto LAB_0038af0f;
      }
    }
  }
  bVar5 = false;
LAB_0038af0f:
  if (bVar5 == false) {
    (*this->thepricer->_vptr_SPxPricer[5])(&local_80);
    local_358.fpclass = cpp_dec_float_finite;
    local_358.prec_elem = 0x10;
    local_358.data._M_elems[0] = 0;
    local_358.data._M_elems[1] = 0;
    local_358.data._M_elems[2] = 0;
    local_358.data._M_elems[3] = 0;
    local_358.data._M_elems[4] = 0;
    local_358.data._M_elems[5] = 0;
    local_358.data._M_elems[6] = 0;
    local_358.data._M_elems[7] = 0;
    local_358.data._M_elems[8] = 0;
    local_358.data._M_elems[9] = 0;
    local_358.data._M_elems[10] = 0;
    local_358.data._M_elems[0xb] = 0;
    local_358.data._M_elems[0xc] = 0;
    local_358.data._M_elems[0xd] = 0;
    local_358.data._M_elems[0xe] = 0;
    local_358.data._M_elems[0xf] = 0;
    local_358.exp = 0;
    local_358.neg = false;
    local_3a8.fpclass = cpp_dec_float_finite;
    local_3a8.prec_elem = 0x10;
    local_3a8.data._M_elems[0] = 0;
    local_3a8.data._M_elems[1] = 0;
    local_3a8.data._M_elems[2] = 0;
    local_3a8.data._M_elems[3] = 0;
    local_3a8.data._M_elems[4] = 0;
    local_3a8.data._M_elems[5] = 0;
    local_3a8.data._M_elems[6] = 0;
    local_3a8.data._M_elems[7] = 0;
    local_3a8.data._M_elems[8] = 0;
    local_3a8.data._M_elems[9] = 0;
    local_3a8.data._M_elems[10] = 0;
    local_3a8.data._M_elems[0xb] = 0;
    local_3a8.data._M_elems[0xc] = 0;
    local_3a8.data._M_elems[0xd] = 0;
    local_3a8.data._M_elems._56_5_ = 0;
    local_3a8.data._M_elems[0xf]._1_3_ = 0;
    local_3a8.exp = 0;
    local_3a8.neg = false;
    boost::multiprecision::backends::cpp_dec_float<100u,int,void>::operator=
              ((cpp_dec_float<100u,int,void> *)&local_3a8,10.0);
    boost::multiprecision::default_ops::
    eval_divide<boost::multiprecision::backends::cpp_dec_float<100u,int,void>,boost::multiprecision::backends::cpp_dec_float<100u,int,void>,boost::multiprecision::backends::cpp_dec_float<100u,int,void>>
              (&local_358,&local_80,&local_3a8);
    (newpricertol->m_backend).data._M_elems[0xc] = local_358.data._M_elems[0xc];
    (newpricertol->m_backend).data._M_elems[0xd] = local_358.data._M_elems[0xd];
    (newpricertol->m_backend).data._M_elems[0xe] = local_358.data._M_elems[0xe];
    (newpricertol->m_backend).data._M_elems[0xf] = local_358.data._M_elems[0xf];
    (newpricertol->m_backend).data._M_elems[8] = local_358.data._M_elems[8];
    (newpricertol->m_backend).data._M_elems[9] = local_358.data._M_elems[9];
    (newpricertol->m_backend).data._M_elems[10] = local_358.data._M_elems[10];
    (newpricertol->m_backend).data._M_elems[0xb] = local_358.data._M_elems[0xb];
    (newpricertol->m_backend).data._M_elems[4] = local_358.data._M_elems[4];
    (newpricertol->m_backend).data._M_elems[5] = local_358.data._M_elems[5];
    (newpricertol->m_backend).data._M_elems[6] = local_358.data._M_elems[6];
    (newpricertol->m_backend).data._M_elems[7] = local_358.data._M_elems[7];
    (newpricertol->m_backend).data._M_elems[0] = local_358.data._M_elems[0];
    (newpricertol->m_backend).data._M_elems[1] = local_358.data._M_elems[1];
    (newpricertol->m_backend).data._M_elems[2] = local_358.data._M_elems[2];
    (newpricertol->m_backend).data._M_elems[3] = local_358.data._M_elems[3];
    (newpricertol->m_backend).exp = local_358.exp;
    (newpricertol->m_backend).neg = local_358.neg;
    (newpricertol->m_backend).fpclass = local_358.fpclass;
    (newpricertol->m_backend).prec_elem = local_358.prec_elem;
    pSVar1 = this->spxout;
    if ((pSVar1 != (SPxOut *)0x0) && (4 < (int)pSVar1->m_verbosity)) {
      local_3a8.data._M_elems[0] = pSVar1->m_verbosity;
      local_358.data._M_elems[0] = 5;
      (*pSVar1->_vptr_SPxOut[2])();
      pSVar1 = this->spxout;
      std::__ostream_insert<char,std::char_traits<char>>
                (pSVar1->m_streams[pSVar1->m_verbosity],"Precision not reached: Pricer tolerance = "
                 ,0x2a);
      (*this->thepricer->_vptr_SPxPricer[5])(&local_d0);
      boost::multiprecision::operator<<(pSVar1->m_streams[pSVar1->m_verbosity],&local_d0);
      std::__ostream_insert<char,std::char_traits<char>>
                (pSVar1->m_streams[pSVar1->m_verbosity]," new tolerance = ",0x11);
      local_128.m_backend.data._M_elems._0_8_ =
           *(undefined8 *)(newpricertol->m_backend).data._M_elems;
      local_128.m_backend.data._M_elems._8_8_ =
           *(undefined8 *)((newpricertol->m_backend).data._M_elems + 2);
      local_128.m_backend.data._M_elems._16_8_ =
           *(undefined8 *)((newpricertol->m_backend).data._M_elems + 4);
      local_128.m_backend.data._M_elems._24_8_ =
           *(undefined8 *)((newpricertol->m_backend).data._M_elems + 6);
      local_128.m_backend.data._M_elems._32_8_ =
           *(undefined8 *)((newpricertol->m_backend).data._M_elems + 8);
      local_128.m_backend.data._M_elems._40_8_ =
           *(undefined8 *)((newpricertol->m_backend).data._M_elems + 10);
      local_128.m_backend.data._M_elems._48_8_ =
           *(undefined8 *)((newpricertol->m_backend).data._M_elems + 0xc);
      local_128.m_backend.data._M_elems._56_8_ =
           *(undefined8 *)((newpricertol->m_backend).data._M_elems + 0xe);
      local_128.m_backend.exp = (newpricertol->m_backend).exp;
      local_128.m_backend.neg = (newpricertol->m_backend).neg;
      local_128.m_backend.fpclass = (newpricertol->m_backend).fpclass;
      local_128.m_backend.prec_elem = (newpricertol->m_backend).prec_elem;
      boost::multiprecision::operator<<(pSVar1->m_streams[pSVar1->m_verbosity],&local_128);
      cVar3 = (char)pSVar1->m_streams[pSVar1->m_verbosity];
      std::ios::widen((char)*(undefined8 *)(*(long *)pSVar1->m_streams[pSVar1->m_verbosity] + -0x18)
                      + cVar3);
      std::ostream::put(cVar3);
      std::ostream::flush();
      std::__ostream_insert<char,std::char_traits<char>>
                (pSVar1->m_streams[pSVar1->m_verbosity]," maxViolRedCost= ",0x11);
      local_178.m_backend.data._M_elems[0xf]._1_3_ = local_4e8.data._M_elems[0xf]._1_3_;
      local_178.m_backend.data._M_elems._56_5_ = local_4e8.data._M_elems._56_5_;
      local_178.m_backend.data._M_elems[0] = local_4e8.data._M_elems[0];
      local_178.m_backend.data._M_elems[1] = local_4e8.data._M_elems[1];
      local_178.m_backend.data._M_elems[2] = local_4e8.data._M_elems[2];
      local_178.m_backend.data._M_elems[3] = local_4e8.data._M_elems[3];
      local_178.m_backend.data._M_elems[4] = local_4e8.data._M_elems[4];
      local_178.m_backend.data._M_elems[5] = local_4e8.data._M_elems[5];
      local_178.m_backend.data._M_elems[6] = local_4e8.data._M_elems[6];
      local_178.m_backend.data._M_elems[7] = local_4e8.data._M_elems[7];
      local_178.m_backend.data._M_elems[8] = local_4e8.data._M_elems[8];
      local_178.m_backend.data._M_elems[9] = local_4e8.data._M_elems[9];
      local_178.m_backend.data._M_elems[10] = local_4e8.data._M_elems[10];
      local_178.m_backend.data._M_elems[0xb] = local_4e8.data._M_elems[0xb];
      local_178.m_backend.data._M_elems[0xc] = local_4e8.data._M_elems[0xc];
      local_178.m_backend.data._M_elems[0xd] = local_4e8.data._M_elems[0xd];
      local_178.m_backend.exp = local_4e8.exp;
      local_178.m_backend.neg = local_4e8.neg;
      local_178.m_backend.fpclass = local_4e8.fpclass;
      local_178.m_backend.prec_elem = local_4e8.prec_elem;
      boost::multiprecision::operator<<(pSVar1->m_streams[pSVar1->m_verbosity],&local_178);
      std::__ostream_insert<char,std::char_traits<char>>
                (pSVar1->m_streams[pSVar1->m_verbosity]," maxViolBounds= ",0x10);
      local_1c8.m_backend.data._M_elems[0xf]._1_3_ = local_538.data._M_elems[0xf]._1_3_;
      local_1c8.m_backend.data._M_elems._56_5_ = local_538.data._M_elems._56_5_;
      local_1c8.m_backend.data._M_elems[0] = local_538.data._M_elems[0];
      local_1c8.m_backend.data._M_elems[1] = local_538.data._M_elems[1];
      local_1c8.m_backend.data._M_elems[2] = local_538.data._M_elems[2];
      local_1c8.m_backend.data._M_elems[3] = local_538.data._M_elems[3];
      local_1c8.m_backend.data._M_elems[4] = local_538.data._M_elems[4];
      local_1c8.m_backend.data._M_elems[5] = local_538.data._M_elems[5];
      local_1c8.m_backend.data._M_elems[6] = local_538.data._M_elems[6];
      local_1c8.m_backend.data._M_elems[7] = local_538.data._M_elems[7];
      local_1c8.m_backend.data._M_elems[8] = local_538.data._M_elems[8];
      local_1c8.m_backend.data._M_elems[9] = local_538.data._M_elems[9];
      local_1c8.m_backend.data._M_elems[10] = local_538.data._M_elems[10];
      local_1c8.m_backend.data._M_elems[0xb] = local_538.data._M_elems[0xb];
      local_1c8.m_backend.data._M_elems[0xc] = local_538.data._M_elems[0xc];
      local_1c8.m_backend.data._M_elems[0xd] = local_538.data._M_elems[0xd];
      local_1c8.m_backend.exp = local_538.exp;
      local_1c8.m_backend.neg = local_538.neg;
      local_1c8.m_backend.fpclass = local_538.fpclass;
      local_1c8.m_backend.prec_elem = local_538.prec_elem;
      boost::multiprecision::operator<<(pSVar1->m_streams[pSVar1->m_verbosity],&local_1c8);
      std::__ostream_insert<char,std::char_traits<char>>
                (pSVar1->m_streams[pSVar1->m_verbosity]," maxViolConst= ",0xf);
      local_218.m_backend.data._M_elems[0xf]._1_3_ = local_588.data._M_elems[0xf]._1_3_;
      local_218.m_backend.data._M_elems._56_5_ = local_588.data._M_elems._56_5_;
      local_218.m_backend.data._M_elems[0] = local_588.data._M_elems[0];
      local_218.m_backend.data._M_elems[1] = local_588.data._M_elems[1];
      local_218.m_backend.data._M_elems[2] = local_588.data._M_elems[2];
      local_218.m_backend.data._M_elems[3] = local_588.data._M_elems[3];
      local_218.m_backend.data._M_elems[4] = local_588.data._M_elems[4];
      local_218.m_backend.data._M_elems[5] = local_588.data._M_elems[5];
      local_218.m_backend.data._M_elems[6] = local_588.data._M_elems[6];
      local_218.m_backend.data._M_elems[7] = local_588.data._M_elems[7];
      local_218.m_backend.data._M_elems[8] = local_588.data._M_elems[8];
      local_218.m_backend.data._M_elems[9] = local_588.data._M_elems[9];
      local_218.m_backend.data._M_elems[10] = local_588.data._M_elems[10];
      local_218.m_backend.data._M_elems[0xb] = local_588.data._M_elems[0xb];
      local_218.m_backend.data._M_elems[0xc] = local_588.data._M_elems[0xc];
      local_218.m_backend.data._M_elems[0xd] = local_588.data._M_elems[0xd];
      local_218.m_backend.exp = local_588.exp;
      local_218.m_backend.neg = local_588.neg;
      local_218.m_backend.fpclass = local_588.fpclass;
      local_218.m_backend.prec_elem = local_588.prec_elem;
      boost::multiprecision::operator<<(pSVar1->m_streams[pSVar1->m_verbosity],&local_218);
      cVar3 = (char)pSVar1->m_streams[pSVar1->m_verbosity];
      std::ios::widen((char)*(undefined8 *)(*(long *)pSVar1->m_streams[pSVar1->m_verbosity] + -0x18)
                      + cVar3);
      std::ostream::put(cVar3);
      std::ostream::flush();
      std::__ostream_insert<char,std::char_traits<char>>
                (pSVar1->m_streams[pSVar1->m_verbosity]," sumViolRedCost= ",0x11);
      local_268.m_backend.data._M_elems[0xf]._1_3_ = uStack_3bb;
      local_268.m_backend.data._M_elems._56_5_ = uStack_3c0;
      local_268.m_backend.data._M_elems[0] = local_3f8[0];
      local_268.m_backend.data._M_elems[1] = local_3f8[1];
      local_268.m_backend.data._M_elems[2] = local_3f8[2];
      local_268.m_backend.data._M_elems[3] = local_3f8[3];
      local_268.m_backend.data._M_elems[4] = local_3f8[4];
      local_268.m_backend.data._M_elems[5] = local_3f8[5];
      local_268.m_backend.data._M_elems[6] = local_3f8[6];
      local_268.m_backend.data._M_elems[7] = local_3f8[7];
      local_268.m_backend.data._M_elems[8] = local_3f8[8];
      local_268.m_backend.data._M_elems[9] = local_3f8[9];
      local_268.m_backend.data._M_elems[10] = local_3f8[10];
      local_268.m_backend.data._M_elems[0xb] = local_3f8[0xb];
      local_268.m_backend.data._M_elems[0xc] = local_3f8[0xc];
      local_268.m_backend.data._M_elems[0xd] = local_3f8[0xd];
      local_268.m_backend.exp = iStack_3b8;
      local_268.m_backend.neg = (bool)uStack_3b4;
      local_268.m_backend.fpclass = (fpclass_type)local_3b0;
      local_268.m_backend.prec_elem = local_3b0._4_4_;
      boost::multiprecision::operator<<(pSVar1->m_streams[pSVar1->m_verbosity],&local_268);
      std::__ostream_insert<char,std::char_traits<char>>
                (pSVar1->m_streams[pSVar1->m_verbosity]," sumViolBounds= ",0x10);
      local_2b8.m_backend.data._M_elems[0xf]._1_3_ = uStack_40b;
      local_2b8.m_backend.data._M_elems._56_5_ = uStack_410;
      local_2b8.m_backend.data._M_elems[0] = local_448[0];
      local_2b8.m_backend.data._M_elems[1] = local_448[1];
      local_2b8.m_backend.data._M_elems[2] = local_448[2];
      local_2b8.m_backend.data._M_elems[3] = local_448[3];
      local_2b8.m_backend.data._M_elems[4] = local_448[4];
      local_2b8.m_backend.data._M_elems[5] = local_448[5];
      local_2b8.m_backend.data._M_elems[6] = local_448[6];
      local_2b8.m_backend.data._M_elems[7] = local_448[7];
      local_2b8.m_backend.data._M_elems[8] = local_448[8];
      local_2b8.m_backend.data._M_elems[9] = local_448[9];
      local_2b8.m_backend.data._M_elems[10] = local_448[10];
      local_2b8.m_backend.data._M_elems[0xb] = local_448[0xb];
      local_2b8.m_backend.data._M_elems[0xc] = local_448[0xc];
      local_2b8.m_backend.data._M_elems[0xd] = local_448[0xd];
      local_2b8.m_backend.exp = iStack_408;
      local_2b8.m_backend.neg = (bool)uStack_404;
      local_2b8.m_backend.fpclass = (fpclass_type)local_400;
      local_2b8.m_backend.prec_elem = local_400._4_4_;
      boost::multiprecision::operator<<(pSVar1->m_streams[pSVar1->m_verbosity],&local_2b8);
      std::__ostream_insert<char,std::char_traits<char>>
                (pSVar1->m_streams[pSVar1->m_verbosity]," sumViolConst= ",0xf);
      local_308.m_backend.data._M_elems[0xf]._1_3_ = uStack_45b;
      local_308.m_backend.data._M_elems._56_5_ = uStack_460;
      local_308.m_backend.data._M_elems[0] = local_498[0];
      local_308.m_backend.data._M_elems[1] = local_498[1];
      local_308.m_backend.data._M_elems[2] = local_498[2];
      local_308.m_backend.data._M_elems[3] = local_498[3];
      local_308.m_backend.data._M_elems[4] = local_498[4];
      local_308.m_backend.data._M_elems[5] = local_498[5];
      local_308.m_backend.data._M_elems[6] = local_498[6];
      local_308.m_backend.data._M_elems[7] = local_498[7];
      local_308.m_backend.data._M_elems[8] = local_498[8];
      local_308.m_backend.data._M_elems[9] = local_498[9];
      local_308.m_backend.data._M_elems[10] = local_498[10];
      local_308.m_backend.data._M_elems[0xb] = local_498[0xb];
      local_308.m_backend.data._M_elems[0xc] = local_498[0xc];
      local_308.m_backend.data._M_elems[0xd] = local_498[0xd];
      local_308.m_backend.exp = iStack_458;
      local_308.m_backend.neg = (bool)uStack_454;
      local_308.m_backend.fpclass = (fpclass_type)local_450;
      local_308.m_backend.prec_elem = local_450._4_4_;
      boost::multiprecision::operator<<(pSVar1->m_streams[pSVar1->m_verbosity],&local_308);
      cVar3 = (char)pSVar1->m_streams[pSVar1->m_verbosity];
      std::ios::widen((char)*(undefined8 *)(*(long *)pSVar1->m_streams[pSVar1->m_verbosity] + -0x18)
                      + cVar3);
      std::ostream::put(cVar3);
      std::ostream::flush();
      (*this->spxout->_vptr_SPxOut[2])(this->spxout,&local_3a8);
    }
  }
  return bVar5;
}

Assistant:

bool SPxSolverBase<R>::precisionReached(R& newpricertol) const
{
   R maxViolRedCost;
   R sumViolRedCost;
   R maxViolBounds;
   R sumViolBounds;
   R maxViolConst;
   R sumViolConst;

   qualRedCostViolation(maxViolRedCost, sumViolRedCost);
   qualBoundViolation(maxViolBounds, sumViolBounds);
   qualConstraintViolation(maxViolConst, sumViolConst);

   // is the solution good enough ?
   bool reached = maxViolRedCost < tolerances()->floatingPointOpttol()
                  && maxViolBounds < tolerances()->floatingPointFeastol()
                  && maxViolConst < tolerances()->floatingPointFeastol();

   if(!reached)
   {
      newpricertol = thepricer->pricingTolerance() / 10.0;

      SPX_MSG_INFO3((*this->spxout), (*this->spxout) << "Precision not reached: Pricer tolerance = "
                    << thepricer->pricingTolerance()
                    << " new tolerance = " << newpricertol
                    << std::endl
                    << " maxViolRedCost= " << maxViolRedCost
                    << " maxViolBounds= " << maxViolBounds
                    << " maxViolConst= " << maxViolConst
                    << std::endl
                    << " sumViolRedCost= " << sumViolRedCost
                    << " sumViolBounds= " << sumViolBounds
                    << " sumViolConst= " << sumViolConst
                    << std::endl;);
   }

   return reached;
}